

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

void estimate_ref_frame_costs
               (AV1_COMMON *cm,MACROBLOCKD *xd,ModeCosts *mode_costs,int segment_id,
               uint *ref_costs_single,uint (*ref_costs_comp) [8])

{
  int aiVar1 [2];
  int aiVar2 [2];
  uint uVar3;
  int aiVar4 [2];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int (*paiVar15) [3];
  uint *puVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 local_58 [16];
  int local_48;
  undefined8 uStack_44;
  int iStack_3c;
  
  if (((cm->seg).enabled != '\0') &&
     (((cm->seg).feature_mask[(ulong)(uint)segment_id & 0xff] & 0x20) != 0)) {
    ref_costs_single[4] = 0;
    ref_costs_single[5] = 0;
    ref_costs_single[6] = 0;
    ref_costs_single[7] = 0;
    ref_costs_single[0] = 0;
    ref_costs_single[1] = 0;
    ref_costs_single[2] = 0;
    ref_costs_single[3] = 0;
    memset(ref_costs_comp,0,0x100);
    return;
  }
  iVar8 = av1_get_intra_inter_context(xd);
  *ref_costs_single = mode_costs->intra_inter_cost[iVar8][0];
  auVar7 = _DAT_004ca150;
  auVar6 = _DAT_004ca140;
  auVar5 = _DAT_004ca130;
  uVar3 = mode_costs->intra_inter_cost[iVar8][1];
  lVar14 = 0;
  do {
    auVar26._8_4_ = (int)lVar14;
    auVar26._0_8_ = lVar14;
    auVar26._12_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar27 = (auVar26 | auVar6) ^ auVar7;
    if (auVar27._4_4_ == -0x80000000 && auVar27._0_4_ < -0x7ffffff9) {
      ref_costs_single[lVar14 + 1] = uVar3;
      ref_costs_single[lVar14 + 2] = uVar3;
    }
    auVar26 = (auVar26 | auVar5) ^ auVar7;
    if (auVar26._4_4_ == -0x80000000 && auVar26._0_4_ < -0x7ffffff9) {
      ref_costs_single[lVar14 + 3] = uVar3;
      ref_costs_single[lVar14 + 4] = uVar3;
    }
    lVar14 = lVar14 + 4;
  } while (lVar14 != 8);
  iVar8 = av1_get_pred_context_single_ref_p1(xd);
  iVar9 = av1_get_pred_context_single_ref_p2(xd);
  iVar10 = av1_get_pred_context_single_ref_p3(xd);
  iVar11 = av1_get_pred_context_single_ref_p4(xd);
  iVar12 = av1_get_pred_context_single_ref_p5(xd);
  iVar13 = av1_get_pred_context_single_ref_p6(xd);
  uVar23 = ref_costs_single[1] + mode_costs->single_ref_cost[iVar8][0][0];
  ref_costs_single[1] = uVar23;
  uVar19 = ref_costs_single[2] + mode_costs->single_ref_cost[iVar8][0][0];
  ref_costs_single[2] = uVar19;
  uVar21 = ref_costs_single[3] + mode_costs->single_ref_cost[iVar8][0][0];
  ref_costs_single[3] = uVar21;
  uVar22 = ref_costs_single[4] + mode_costs->single_ref_cost[iVar8][0][0];
  ref_costs_single[4] = uVar22;
  uVar17 = ref_costs_single[5] + mode_costs->single_ref_cost[iVar8][0][1];
  ref_costs_single[5] = uVar17;
  uVar18 = ref_costs_single[6] + mode_costs->single_ref_cost[iVar8][0][1];
  ref_costs_single[6] = uVar18;
  uVar24 = ref_costs_single[7] + mode_costs->single_ref_cost[iVar8][0][1];
  ref_costs_single[7] = uVar24;
  uVar23 = uVar23 + mode_costs->single_ref_cost[iVar10][2][0];
  ref_costs_single[1] = uVar23;
  uVar19 = uVar19 + mode_costs->single_ref_cost[iVar10][2][0];
  ref_costs_single[2] = uVar19;
  uVar21 = uVar21 + mode_costs->single_ref_cost[iVar10][2][1];
  ref_costs_single[3] = uVar21;
  uVar22 = uVar22 + mode_costs->single_ref_cost[iVar10][2][1];
  ref_costs_single[4] = uVar22;
  uVar17 = uVar17 + mode_costs->single_ref_cost[iVar9][1][0];
  ref_costs_single[5] = uVar17;
  uVar18 = uVar18 + mode_costs->single_ref_cost[iVar9][1][0];
  ref_costs_single[6] = uVar18;
  ref_costs_single[7] = uVar24 + mode_costs->single_ref_cost[iVar9][1][1];
  ref_costs_single[1] = uVar23 + mode_costs->single_ref_cost[iVar11][3][0];
  ref_costs_single[2] = uVar19 + mode_costs->single_ref_cost[iVar11][3][1];
  ref_costs_single[3] = uVar21 + mode_costs->single_ref_cost[iVar12][4][0];
  ref_costs_single[4] = uVar22 + mode_costs->single_ref_cost[iVar12][4][1];
  ref_costs_single[5] = uVar17 + mode_costs->single_ref_cost[iVar13][5][0];
  ref_costs_single[6] = uVar18 + mode_costs->single_ref_cost[iVar13][5][1];
  if ((cm->current_frame).reference_mode == '\0') {
    lVar14 = 0;
    do {
      *(undefined8 *)((long)ref_costs_comp[1] + lVar14 + 0x14) = 0x20000000200;
      *(undefined4 *)((long)ref_costs_comp[1] + lVar14 + 0x1c) = 0x200;
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != 0x80);
    *(uint *)((long)(ref_costs_comp + 1) + 8) = 0x200;
    *(uint *)((long)(ref_costs_comp + 1) + 0xc) = 0x200;
    ref_costs_comp[1][4] = 0x200;
    ref_costs_comp[5][7] = 0x200;
  }
  else {
    iVar8 = av1_get_pred_context_comp_bwdref_p(xd);
    iVar9 = av1_get_pred_context_comp_bwdref_p1(xd);
    iVar10 = av1_get_pred_context_comp_ref_p(xd);
    iVar11 = av1_get_pred_context_comp_ref_p1(xd);
    iVar12 = av1_get_pred_context_comp_ref_p2(xd);
    iVar13 = av1_get_comp_reference_type_context(xd);
    paiVar15 = mode_costs->comp_ref_type_cost + iVar13;
    iVar13 = mode_costs->comp_ref_type_cost[iVar13][1] + uVar3;
    aiVar1 = mode_costs->comp_ref_cost[iVar10][0];
    iVar10 = aiVar1[0];
    iVar25 = aiVar1[1];
    aiVar1 = mode_costs->comp_ref_cost[iVar12][2];
    aiVar2 = mode_costs->comp_ref_cost[iVar11][1];
    local_58._4_4_ = aiVar2[1] + iVar10 + iVar13;
    local_58._0_4_ = aiVar2[0] + iVar10 + iVar13;
    local_58._8_4_ = aiVar1[0] + iVar25 + iVar13;
    local_58._12_4_ = 0;
    local_58 = local_58 << 0x20;
    aiVar4 = mode_costs->comp_bwdref_cost[iVar8][0];
    iVar8 = aiVar4[0];
    aiVar2 = mode_costs->comp_bwdref_cost[iVar9][1];
    uStack_44._4_4_ = iVar8 + aiVar2[1];
    uStack_44._0_4_ = iVar8 + aiVar2[0];
    iStack_3c = aiVar4[1];
    local_48 = aiVar1[1] + iVar25 + iVar13;
    puVar16 = ref_costs_comp[1] + 5;
    lVar14 = 1;
    do {
      iVar8 = *(int *)(local_58 + lVar14 * 4);
      lVar20 = 0;
      do {
        puVar16[lVar20] = *(int *)((long)&uStack_44 + lVar20 * 4) + iVar8;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 3);
      lVar14 = lVar14 + 1;
      puVar16 = puVar16 + 8;
    } while (lVar14 != 5);
    iVar8 = av1_get_pred_context_uni_comp_ref_p(xd);
    iVar9 = av1_get_pred_context_uni_comp_ref_p1(xd);
    iVar10 = av1_get_pred_context_uni_comp_ref_p2(xd);
    ref_costs_comp[1][2] =
         (*paiVar15)[0] + uVar3 + mode_costs->uni_comp_ref_cost[iVar8][0][0] +
         mode_costs->uni_comp_ref_cost[iVar9][1][0];
    ref_costs_comp[1][3] =
         (*paiVar15)[0] + uVar3 + mode_costs->uni_comp_ref_cost[iVar8][0][0] +
         mode_costs->uni_comp_ref_cost[iVar9][1][1] + mode_costs->uni_comp_ref_cost[iVar10][2][0];
    ref_costs_comp[1][4] =
         (*paiVar15)[0] + uVar3 + mode_costs->uni_comp_ref_cost[iVar8][0][0] +
         mode_costs->uni_comp_ref_cost[iVar9][1][1] + mode_costs->uni_comp_ref_cost[iVar10][2][1];
    ref_costs_comp[5][7] = uVar3 + (*paiVar15)[0] + mode_costs->uni_comp_ref_cost[iVar8][0][1];
  }
  return;
}

Assistant:

static inline void estimate_ref_frame_costs(
    const AV1_COMMON *cm, const MACROBLOCKD *xd, const ModeCosts *mode_costs,
    int segment_id, unsigned int *ref_costs_single,
    unsigned int (*ref_costs_comp)[REF_FRAMES]) {
  int seg_ref_active =
      segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME);
  if (seg_ref_active) {
    memset(ref_costs_single, 0, REF_FRAMES * sizeof(*ref_costs_single));
    int ref_frame;
    for (ref_frame = 0; ref_frame < REF_FRAMES; ++ref_frame)
      memset(ref_costs_comp[ref_frame], 0,
             REF_FRAMES * sizeof((*ref_costs_comp)[0]));
  } else {
    int intra_inter_ctx = av1_get_intra_inter_context(xd);
    ref_costs_single[INTRA_FRAME] =
        mode_costs->intra_inter_cost[intra_inter_ctx][0];
    unsigned int base_cost = mode_costs->intra_inter_cost[intra_inter_ctx][1];

    for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i)
      ref_costs_single[i] = base_cost;

    const int ctx_p1 = av1_get_pred_context_single_ref_p1(xd);
    const int ctx_p2 = av1_get_pred_context_single_ref_p2(xd);
    const int ctx_p3 = av1_get_pred_context_single_ref_p3(xd);
    const int ctx_p4 = av1_get_pred_context_single_ref_p4(xd);
    const int ctx_p5 = av1_get_pred_context_single_ref_p5(xd);
    const int ctx_p6 = av1_get_pred_context_single_ref_p6(xd);

    // Determine cost of a single ref frame, where frame types are represented
    // by a tree:
    // Level 0: add cost whether this ref is a forward or backward ref
    ref_costs_single[LAST_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[LAST2_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[LAST3_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][0];
    ref_costs_single[BWDREF_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][1];
    ref_costs_single[ALTREF2_FRAME] +=
        mode_costs->single_ref_cost[ctx_p1][0][1];
    ref_costs_single[ALTREF_FRAME] += mode_costs->single_ref_cost[ctx_p1][0][1];

    // Level 1: if this ref is forward ref,
    // add cost whether it is last/last2 or last3/golden
    ref_costs_single[LAST_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][0];
    ref_costs_single[LAST2_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][0];
    ref_costs_single[LAST3_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][1];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[ctx_p3][2][1];

    // Level 1: if this ref is backward ref
    // then add cost whether this ref is altref or backward ref
    ref_costs_single[BWDREF_FRAME] += mode_costs->single_ref_cost[ctx_p2][1][0];
    ref_costs_single[ALTREF2_FRAME] +=
        mode_costs->single_ref_cost[ctx_p2][1][0];
    ref_costs_single[ALTREF_FRAME] += mode_costs->single_ref_cost[ctx_p2][1][1];

    // Level 2: further add cost whether this ref is last or last2
    ref_costs_single[LAST_FRAME] += mode_costs->single_ref_cost[ctx_p4][3][0];
    ref_costs_single[LAST2_FRAME] += mode_costs->single_ref_cost[ctx_p4][3][1];

    // Level 2: last3 or golden
    ref_costs_single[LAST3_FRAME] += mode_costs->single_ref_cost[ctx_p5][4][0];
    ref_costs_single[GOLDEN_FRAME] += mode_costs->single_ref_cost[ctx_p5][4][1];

    // Level 2: bwdref or altref2
    ref_costs_single[BWDREF_FRAME] += mode_costs->single_ref_cost[ctx_p6][5][0];
    ref_costs_single[ALTREF2_FRAME] +=
        mode_costs->single_ref_cost[ctx_p6][5][1];

    if (cm->current_frame.reference_mode != SINGLE_REFERENCE) {
      // Similar to single ref, determine cost of compound ref frames.
      // cost_compound_refs = cost_first_ref + cost_second_ref
      const int bwdref_comp_ctx_p = av1_get_pred_context_comp_bwdref_p(xd);
      const int bwdref_comp_ctx_p1 = av1_get_pred_context_comp_bwdref_p1(xd);
      const int ref_comp_ctx_p = av1_get_pred_context_comp_ref_p(xd);
      const int ref_comp_ctx_p1 = av1_get_pred_context_comp_ref_p1(xd);
      const int ref_comp_ctx_p2 = av1_get_pred_context_comp_ref_p2(xd);

      const int comp_ref_type_ctx = av1_get_comp_reference_type_context(xd);
      unsigned int ref_bicomp_costs[REF_FRAMES] = { 0 };

      ref_bicomp_costs[LAST_FRAME] = ref_bicomp_costs[LAST2_FRAME] =
          ref_bicomp_costs[LAST3_FRAME] = ref_bicomp_costs[GOLDEN_FRAME] =
              base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][1];
      ref_bicomp_costs[BWDREF_FRAME] = ref_bicomp_costs[ALTREF2_FRAME] = 0;
      ref_bicomp_costs[ALTREF_FRAME] = 0;

      // cost of first ref frame
      ref_bicomp_costs[LAST_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][0];
      ref_bicomp_costs[LAST2_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][0];
      ref_bicomp_costs[LAST3_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][1];
      ref_bicomp_costs[GOLDEN_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p][0][1];

      ref_bicomp_costs[LAST_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p1][1][0];
      ref_bicomp_costs[LAST2_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p1][1][1];

      ref_bicomp_costs[LAST3_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p2][2][0];
      ref_bicomp_costs[GOLDEN_FRAME] +=
          mode_costs->comp_ref_cost[ref_comp_ctx_p2][2][1];

      // cost of second ref frame
      ref_bicomp_costs[BWDREF_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p][0][0];
      ref_bicomp_costs[ALTREF2_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p][0][0];
      ref_bicomp_costs[ALTREF_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p][0][1];

      ref_bicomp_costs[BWDREF_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p1][1][0];
      ref_bicomp_costs[ALTREF2_FRAME] +=
          mode_costs->comp_bwdref_cost[bwdref_comp_ctx_p1][1][1];

      // cost: if one ref frame is forward ref, the other ref is backward ref
      int ref0, ref1;
      for (ref0 = LAST_FRAME; ref0 <= GOLDEN_FRAME; ++ref0) {
        for (ref1 = BWDREF_FRAME; ref1 <= ALTREF_FRAME; ++ref1) {
          ref_costs_comp[ref0][ref1] =
              ref_bicomp_costs[ref0] + ref_bicomp_costs[ref1];
        }
      }

      // cost: if both ref frames are the same side.
      const int uni_comp_ref_ctx_p = av1_get_pred_context_uni_comp_ref_p(xd);
      const int uni_comp_ref_ctx_p1 = av1_get_pred_context_uni_comp_ref_p1(xd);
      const int uni_comp_ref_ctx_p2 = av1_get_pred_context_uni_comp_ref_p2(xd);
      ref_costs_comp[LAST_FRAME][LAST2_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p1][1][0];
      ref_costs_comp[LAST_FRAME][LAST3_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p1][1][1] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p2][2][0];
      ref_costs_comp[LAST_FRAME][GOLDEN_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p1][1][1] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p2][2][1];
      ref_costs_comp[BWDREF_FRAME][ALTREF_FRAME] =
          base_cost + mode_costs->comp_ref_type_cost[comp_ref_type_ctx][0] +
          mode_costs->uni_comp_ref_cost[uni_comp_ref_ctx_p][0][1];
    } else {
      int ref0, ref1;
      for (ref0 = LAST_FRAME; ref0 <= GOLDEN_FRAME; ++ref0) {
        for (ref1 = BWDREF_FRAME; ref1 <= ALTREF_FRAME; ++ref1)
          ref_costs_comp[ref0][ref1] = 512;
      }
      ref_costs_comp[LAST_FRAME][LAST2_FRAME] = 512;
      ref_costs_comp[LAST_FRAME][LAST3_FRAME] = 512;
      ref_costs_comp[LAST_FRAME][GOLDEN_FRAME] = 512;
      ref_costs_comp[BWDREF_FRAME][ALTREF_FRAME] = 512;
    }
  }
}